

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

void __thiscall
Lib::DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
expand(DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
       *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  Entry *res;
  Entry *pEVar7;
  Exception *this_00;
  Entry *pEVar8;
  ulong uVar9;
  void **head;
  long lVar10;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar10 = (long)iVar1;
  uVar9 = lVar10 * 0x18 + 0xfU & 0xfffffffffffffff0;
  if (uVar9 == 0) {
    pEVar7 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pEVar7 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
  }
  else if (uVar9 < 0x19) {
    pEVar7 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
  }
  else if (uVar9 < 0x21) {
    pEVar7 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
  }
  else if (uVar9 < 0x31) {
    pEVar7 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
  }
  else if (uVar9 < 0x41) {
    pEVar7 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
  }
  else {
    pEVar7 = (Entry *)::operator_new(uVar9,0x10);
  }
  pEVar5 = this->_entries;
  pEVar6 = this->_afterLast;
  uVar2 = this->_timestamp;
  iVar3 = this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar4 = this->_capacityIndex;
  this->_capacityIndex = iVar4 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar4 * 4 + 4);
  pEVar8 = pEVar7;
  if (iVar1 == 0) {
    lVar10 = 0;
  }
  else {
    do {
      (pEVar8->field_0)._infoData = 0;
      (pEVar8->_key)._content = 2;
      lVar10 = lVar10 + -1;
      pEVar8 = pEVar8 + 1;
    } while (lVar10 != 0);
    lVar10 = (long)this->_capacity;
  }
  this->_entries = pEVar7;
  this->_afterLast = pEVar7 + lVar10;
  for (pEVar7 = pEVar5; pEVar7 != pEVar6; pEVar7 = pEVar7 + 1) {
    if (((pEVar7->field_0)._infoData & 1U) == 0 && (uint)(pEVar7->field_0)._infoData >> 2 == uVar2)
    {
      insert(this,(TermList)(pEVar7->_key)._content,pEVar7->_val);
    }
  }
  if ((iVar3 != 0) && (pEVar5 != (Entry *)0x0)) {
    uVar9 = (long)iVar3 * 0x18 + 0xfU & 0xfffffffffffffff0;
    if (uVar9 == 0) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar5;
    }
    else if (uVar9 < 0x11) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar5;
    }
    else if (uVar9 < 0x19) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar5;
    }
    else if (uVar9 < 0x21) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar5;
    }
    else if (uVar9 < 0x31) {
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar5;
    }
    else {
      if (0x40 < uVar9) {
        operator_delete(pEVar5,0x10);
        return;
      }
      *(undefined8 *)pEVar5 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar5;
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }